

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

void FAudioVoice_GetOutputMatrix
               (FAudioVoice *voice,FAudioVoice *pDestinationVoice,uint32_t SourceChannels,
               uint32_t DestinationChannels,float *pLevelMatrix)

{
  ulong uVar1;
  FAudioVoice **ppFVar2;
  ulong uVar3;
  
  FAudio_PlatformLockMutex(voice->sendLock);
  uVar1 = (ulong)(voice->sends).SendCount;
  if (uVar1 != 0) {
    ppFVar2 = &((voice->sends).pSends)->pOutputVoice;
    uVar3 = 0;
    do {
      if (*ppFVar2 == pDestinationVoice) {
        SDL_memcpy(pLevelMatrix,voice->sendCoefficients[uVar3],
                   (ulong)DestinationChannels * (ulong)SourceChannels * 4);
        break;
      }
      uVar3 = uVar3 + 1;
      ppFVar2 = (FAudioVoice **)((long)ppFVar2 + 0xc);
    } while (uVar1 != uVar3);
  }
  FAudio_PlatformUnlockMutex(voice->sendLock);
  return;
}

Assistant:

void FAudioVoice_GetOutputMatrix(
	FAudioVoice *voice,
	FAudioVoice *pDestinationVoice,
	uint32_t SourceChannels,
	uint32_t DestinationChannels,
	float *pLevelMatrix
) {
	uint32_t i;

	LOG_API_ENTER(voice->audio)
	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	/* Find the send index */
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		if (pDestinationVoice == voice->sends.pSends[i].pOutputVoice)
		{
			break;
		}
	}
	if (i >= voice->sends.SendCount)
	{
		LOG_ERROR(
			voice->audio,
			"Destination not attached to source: %p %p",
			(void*) voice,
			(void*) pDestinationVoice
		)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return;
	}

	/* Verify the Source/Destination channel count */
	if (voice->type == FAUDIO_VOICE_SOURCE)
	{
		FAudio_assert(SourceChannels == voice->src.format->nChannels);
	}
	else
	{
		FAudio_assert(SourceChannels == voice->mix.inputChannels);
	}
	if (pDestinationVoice->type == FAUDIO_VOICE_MASTER)
	{
		FAudio_assert(DestinationChannels == pDestinationVoice->master.inputChannels);
	}
	else
	{
		FAudio_assert(DestinationChannels == pDestinationVoice->mix.inputChannels);
	}

	/* Get the matrix values, finally */
	FAudio_memcpy(
		pLevelMatrix,
		voice->sendCoefficients[i],
		sizeof(float) * SourceChannels * DestinationChannels
	);

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
}